

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

int cram_get_bam_seq(cram_fd *fd,bam_seq_t **bam)

{
  SAM_hdr *pSVar1;
  cram_slice *pcVar2;
  bam_seq_t *pbVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  uint uVar6;
  int iVar7;
  cram_record *pcVar8;
  byte *pbVar9;
  long lVar10;
  uchar *puVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  uchar *puVar16;
  size_t sVar17;
  uint uVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *__dest;
  int iVar21;
  uchar local_438 [1032];
  
  pcVar8 = cram_get_seq(fd);
  if (pcVar8 == (cram_record *)0x0) {
    iVar21 = -1;
  }
  else {
    pSVar1 = fd->header;
    pcVar2 = fd->ctr->slice;
    if ((fd->required_fields & 1) == 0) {
      pcVar15 = "?";
      iVar7 = 1;
    }
    else {
      iVar7 = pcVar8->name_len;
      if (iVar7 == 0) {
        iVar21 = fd->ctr->curr_rec;
        pcVar15 = fd->prefix;
        sVar17 = strlen(pcVar15);
        sVar17 = (size_t)(int)sVar17;
        memcpy(local_438,pcVar15,sVar17);
        puVar11 = local_438 + sVar17 + 1;
        local_438[sVar17] = ':';
        uVar6 = pcVar8->mate_line;
        lVar10 = (ulong)uVar6 + 1;
        if (iVar21 + -1 <= (int)uVar6) {
          lVar10 = (long)iVar21;
        }
        if ((int)uVar6 < 0) {
          lVar10 = (long)iVar21;
        }
        uVar14 = lVar10 + pcVar2->hdr->record_counter;
        if (uVar14 >> 0x20 == 0) {
          puVar11 = append_uint32(puVar11,(uint32_t)uVar14);
          iVar7 = (int)puVar11;
        }
        else {
          uVar13 = uVar14 % 1000000000;
          if (uVar14 < 0xde0b6b3e2feca00) {
            pbVar9 = append_uint32(puVar11,(uint32_t)(uVar14 / 1000000000));
          }
          else {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar14 >> 0x12;
            pbVar9 = append_uint32(puVar11,SUB164(auVar4 * ZEXT816(0x49c97747490f),8) >> 0x18);
            uVar14 = (uVar14 / 1000000000) % 1000000000;
            bVar5 = (byte)(uVar14 / 100000000);
            *pbVar9 = bVar5 | 0x30;
            uVar18 = (int)uVar14 + (uint)bVar5 * -100000000;
            uVar14 = (ulong)uVar18 * 0x6b5fca7;
            pbVar9[1] = (byte)(uVar14 >> 0x32) | 0x30;
            uVar18 = uVar18 + (uint)(uVar14 >> 0x32) * -10000000;
            uVar6 = (uint)((ulong)uVar18 * 0x10c6f7b >> 0x20);
            pbVar9[2] = (char)(uVar6 >> 0xc) + 0x30;
            uVar18 = uVar18 + (uVar6 >> 0xc) * -1000000;
            uVar14 = (ulong)uVar18 * 0xa7c5b;
            pbVar9[3] = (byte)(uVar14 >> 0x24) | 0x30;
            uVar18 = uVar18 + (uint)(uVar14 >> 0x24) * -100000;
            lVar10 = (ulong)uVar18 * 0x68db9;
            pbVar9[4] = (byte)((ulong)lVar10 >> 0x20) | 0x30;
            iVar21 = uVar18 + (int)((ulong)lVar10 >> 0x20) * -10000;
            uVar6 = (uint)(iVar21 * 0x20c5) >> 0x17;
            pbVar9[5] = (char)uVar6 + 0x30;
            uVar18 = iVar21 + uVar6 * -1000;
            uVar6 = (uVar18 & 0xffff) * 0x290;
            pbVar9[6] = (byte)(uVar6 >> 0x10) | 0x30;
            iVar21 = uVar18 + (uVar6 >> 0x10) * -100;
            bVar5 = (byte)((iVar21 * 0x67 & 0xffffU) >> 10);
            pbVar9[7] = bVar5 | 0x30;
            pbVar9[8] = (char)iVar21 + bVar5 * -10 | 0x30;
            pbVar9 = pbVar9 + 9;
          }
          *pbVar9 = (byte)(uVar13 / 100000000) | 0x30;
          uVar18 = (int)uVar13 + (int)(uVar13 / 100000000) * -100000000;
          uVar14 = (ulong)uVar18 * 0x6b5fca7;
          pbVar9[1] = (byte)(uVar14 >> 0x32) | 0x30;
          uVar18 = uVar18 + (uint)(uVar14 >> 0x32) * -10000000;
          uVar6 = (uint)((ulong)uVar18 * 0x10c6f7b >> 0x20);
          pbVar9[2] = (char)(uVar6 >> 0xc) + 0x30;
          uVar18 = uVar18 + (uVar6 >> 0xc) * -1000000;
          uVar14 = (ulong)uVar18 * 0xa7c5b;
          pbVar9[3] = (byte)(uVar14 >> 0x24) | 0x30;
          uVar18 = uVar18 + (uint)(uVar14 >> 0x24) * -100000;
          lVar10 = (ulong)uVar18 * 0x68db9;
          pbVar9[4] = (byte)((ulong)lVar10 >> 0x20) | 0x30;
          iVar21 = uVar18 + (int)((ulong)lVar10 >> 0x20) * -10000;
          uVar6 = (uint)(iVar21 * 0x20c5) >> 0x17;
          pbVar9[5] = (char)uVar6 + 0x30;
          uVar18 = iVar21 + uVar6 * -1000;
          uVar6 = (uVar18 & 0xffff) * 0x290;
          pbVar9[6] = (byte)(uVar6 >> 0x10) | 0x30;
          iVar21 = uVar18 + (uVar6 >> 0x10) * -100;
          bVar5 = (byte)((iVar21 * 0x67 & 0xffffU) >> 10);
          pbVar9[7] = bVar5 | 0x30;
          pbVar9[8] = (char)iVar21 + bVar5 * -10 | 0x30;
          iVar7 = (int)pbVar9 + 9;
        }
        pcVar15 = (char *)local_438;
        iVar7 = iVar7 - (int)pcVar15;
      }
      else {
        pcVar15 = (char *)(pcVar2->name_blk->data + pcVar8->name);
      }
    }
    iVar12 = pcVar8->rg;
    iVar21 = -1;
    if ((-2 < (long)iVar12) && (iVar12 < pSVar1->nrg)) {
      if (iVar12 == -1) {
        iVar12 = 0;
      }
      else {
        iVar12 = pSVar1->rg[iVar12].name_len + 4;
      }
      uVar6 = fd->required_fields;
      if ((uVar6 & 0x600) == 0) {
        pcVar8->len = 1;
        puVar11 = "*";
      }
      else {
        puVar11 = pcVar2->seqs_blk->data;
        if (puVar11 == (uchar *)0x0) {
          return -1;
        }
        puVar11 = puVar11 + pcVar8->seq;
      }
      if ((uVar6 >> 10 & 1) == 0) {
        puVar16 = (uchar *)0x0;
      }
      else {
        puVar16 = pcVar2->qual_blk->data;
        if (puVar16 == (uchar *)0x0) {
          return -1;
        }
        puVar16 = puVar16 + pcVar8->qual;
      }
      iVar7 = bam_construct_seq(bam,(long)iVar12 + (long)pcVar8->aux_size,pcVar15,(long)iVar7,
                                pcVar8->flags,pcVar8->ref_id,pcVar8->apos,pcVar8->aend,pcVar8->mqual
                                ,pcVar8->ncigar,pcVar2->cigar + pcVar8->cigar,pcVar8->mate_ref_id,
                                pcVar8->mate_pos,pcVar8->tlen,pcVar8->len,(char *)puVar11,
                                (char *)puVar16);
      if (iVar7 != -1) {
        pbVar3 = *bam;
        uVar14 = *(ulong *)&(pbVar3->core).field_0x8;
        iVar21 = (pbVar3->core).l_qseq;
        __dest = pbVar3->data +
                 (long)(iVar21 + 1 >> 1) + (uVar14 >> 0x18 & 0xff) + (long)iVar21 +
                 (uVar14 >> 0x30) * 4;
        puVar19 = __dest;
        if ((long)pcVar8->aux_size != 0) {
          memcpy(__dest,pcVar2->aux_blk->data + pcVar8->aux,(long)pcVar8->aux_size);
          puVar19 = __dest + pcVar8->aux_size;
        }
        puVar20 = puVar19;
        if ((long)pcVar8->rg != -1) {
          sVar17 = (size_t)pSVar1->rg[pcVar8->rg].name_len;
          puVar19[0] = 'R';
          puVar19[1] = 'G';
          puVar19[2] = 'Z';
          memcpy(puVar19 + 3,pSVar1->rg[pcVar8->rg].name,sVar17);
          puVar20 = puVar19 + sVar17 + 4;
          puVar19[sVar17 + 3] = '\0';
        }
        iVar21 = iVar7 + ((int)puVar20 - (int)__dest);
      }
    }
  }
  return iVar21;
}

Assistant:

int cram_get_bam_seq(cram_fd *fd, bam_seq_t **bam) {
    cram_record *cr;
    cram_container *c;
    cram_slice *s;

    if (!(cr = cram_get_seq(fd)))
	return -1;

    c = fd->ctr;
    s = c->slice;

    return cram_to_bam(fd->header, fd, s, cr, c->curr_rec-1, bam);
}